

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UsagePositiveNegativeTestCase::testPolygonOffset
          (UsagePositiveNegativeTestCase *this)

{
  ostringstream *poVar1;
  pointer *pppSVar2;
  TextureFormat log;
  RenderContext *pRVar3;
  TestContext *testCtx;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  Renderer referenceRenderer;
  Program local_5f0;
  Surface referenceImage;
  undefined1 local_5b8 [24];
  anon_union_16_3_1194ccdc_for_v aStack_5a0;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  Surface testImage;
  MultisamplePixelBufferAccess local_550;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  MultisamplePixelBufferAccess local_4c0;
  MultisamplePixelBufferAccess local_498;
  PixelBufferAccess local_470;
  DrawCommand local_448;
  undefined1 local_410 [384];
  PrimitiveList local_290;
  ShaderProgram program;
  RenderState state;
  long lVar7;
  
  local_4f8 = 0x3f800000bf800000;
  uStack_4f0 = 0x3f80000000000000;
  local_4e8 = 0x3f8000003f800000;
  uStack_4e0 = 0x3f80000000000000;
  local_4d8 = 0xbf8000003f800000;
  uStack_4d0 = 0x3f80000000000000;
  local_528 = 0xbf800000bf800000;
  uStack_520 = 0x3f80000000000000;
  local_518 = 0x3f800000bf800000;
  uStack_510 = 0x3f80000000000000;
  local_508 = 0xbf8000003f800000;
  uStack_500 = 0x3f80000000000000;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&testImage,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar4,iVar4);
  iVar4 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5b8,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)&local_550);
  glu::makeVtxFragSources((ProgramSources *)local_410,(string *)&state,(string *)local_5b8);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,(ProgramSources *)local_410);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_410);
  std::__cxx11::string::~string((string *)local_5b8);
  std::__cxx11::string::~string((string *)&state);
  uVar5 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_position");
  uVar6 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar7 + 0x1d0))(0x3f800000);
    (**(code **)(lVar7 + 0x188))(0x4100);
    (**(code **)(lVar7 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar7 + 0x4a0))(0x201);
    (**(code **)(lVar7 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar7 + 0x5e0))(0xb71);
    (**(code **)(lVar7 + 0x5e0))(0x8037);
    (**(code **)(lVar7 + 0x610))(uVar5);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"DepthFunc = GL_LESS.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,&local_528);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw top-left. Color = White.\tState: PolygonOffset(0, 0).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0,0);
    (**(code **)(lVar7 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw top-left. Color = Green.\tState: PolygonOffset(0, -1).")
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0,0xbf800000);
    (**(code **)(lVar7 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,&local_4f8);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw bottom-right. Color = White.\tState: PolygonOffset(0, 1).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0,0x3f800000);
    (**(code **)(lVar7 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw bottom-right. Color = Yellow.\tState: PolygonOffset(0, 0).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x1028))(0,0);
    (**(code **)(lVar7 + 0x1858))(0x3f800000,0x3f800000,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    (**(code **)(lVar7 + 0x518))(uVar5);
    (**(code **)(lVar7 + 0x1680))(0);
    (**(code **)(lVar7 + 0x648))();
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_410,&testImage);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_410);
    glu::ShaderProgram::~ShaderProgram(&program);
    rr::Renderer::Renderer(&referenceRenderer);
    local_578 = 0;
    uStack_570 = 0;
    local_588 = 0;
    uStack_580 = 0;
    aStack_5a0._8_8_ = 0;
    uStack_590 = 0;
    local_5b8._16_8_ = 0;
    aStack_5a0._0_8_ = 0;
    local_5b8._0_8_ = (pointer)0x0;
    local_5b8._8_8_ = 0;
    local_410._8_4_ = (this->super_PolygonOffsetTestCase).m_targetSize;
    local_410._0_4_ = R;
    local_410._4_4_ = SNORM_INT8;
    local_410._16_8_ = (pointer)0x3f80000000000000;
    local_410._12_4_ = local_410._8_4_;
    rr::RenderState::RenderState(&state,(ViewportState *)local_410,VIEWPORTORIENTATION_LOWER_LEFT);
    PositionColorShader::PositionColorShader((PositionColorShader *)&program);
    local_5b8._0_8_ = (pointer)0x400000000;
    local_5b8._8_8_ = 0;
    local_5b8._16_8_ = &local_528;
    uStack_590 = CONCAT44(uStack_590._4_4_,0x22);
    local_578 = 0x3f80000000000000;
    uStack_570 = 0x3f80000000000000;
    tcu::Surface::getAccess((PixelBufferAccess *)local_410,&referenceImage);
    local_448.state = (RenderState *)0x0;
    local_448.renderTarget = (RenderTarget *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_410,(Vec4 *)&local_448);
    poVar1 = (ostringstream *)(local_410 + 8);
    local_410._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Expecting: Top-left = Green, Bottom-right = Yellow.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_410,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess(&local_470,&referenceImage);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_550,&local_470);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_498);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_4c0);
    rr::RenderTarget::RenderTarget((RenderTarget *)local_410,&local_550,&local_498,&local_4c0);
    pppSVar2 = &program.m_shaders[5].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_5f0.geometryShader = (GeometryShader *)0x0;
    local_5f0.vertexShader = (VertexShader *)&program;
    local_5f0.fragmentShader = (FragmentShader *)pppSVar2;
    rr::PrimitiveList::PrimitiveList(&local_290,PRIMITIVETYPE_TRIANGLES,3,0);
    local_448.state = &state;
    local_448.numVertexAttribs = 2;
    local_448.vertexAttribs = (VertexAttrib *)local_5b8;
    local_448.renderTarget = (RenderTarget *)local_410;
    local_448.program = &local_5f0;
    local_448.primitives = &local_290;
    rr::Renderer::draw(&referenceRenderer,&local_448);
    local_5b8._16_8_ = &local_4f8;
    local_578 = 0x3f8000003f800000;
    uStack_570 = 0x3f80000000000000;
    tcu::Surface::getAccess(&local_470,&referenceImage);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_550,&local_470);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_498);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_4c0);
    rr::RenderTarget::RenderTarget((RenderTarget *)local_410,&local_550,&local_498,&local_4c0);
    local_5f0.geometryShader = (GeometryShader *)0x0;
    local_5f0.vertexShader = (VertexShader *)&program;
    local_5f0.fragmentShader = (FragmentShader *)pppSVar2;
    rr::PrimitiveList::PrimitiveList(&local_290,PRIMITIVETYPE_TRIANGLES,3,0);
    local_448.state = &state;
    local_448.numVertexAttribs = 2;
    local_448.vertexAttribs = (VertexAttrib *)local_5b8;
    local_448.renderTarget = (RenderTarget *)local_410;
    local_448.program = &local_5f0;
    local_448.primitives = &local_290;
    rr::Renderer::draw(&referenceRenderer,&local_448);
    sglr::ShaderProgram::~ShaderProgram((ShaderProgram *)&program);
    rr::Renderer::~Renderer(&referenceRenderer);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_410,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages((TestLog *)log,testCtx,pRVar3,(ConstPixelBufferAccess *)local_410,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<((TestLog *)log,&program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x26e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsagePositiveNegativeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangleBottomRight[] =
	{
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};
	const tcu::Vec4 triangleTopLeft[] =
	{
		tcu::Vec4(-1, -1,  0,  1),
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.depthFunc				(GL_LESS);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "DepthFunc = GL_LESS." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		//draw top left (negative offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleTopLeft);

			log << TestLog::Message << "Draw top-left. Color = White.\tState: PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw top-left. Color = Green.\tState: PolygonOffset(0, -1)." << TestLog::EndMessage;

			gl.polygonOffset			(0, -1);
			gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		//draw bottom right (positive offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleBottomRight);

			log << TestLog::Message << "Draw bottom-right. Color = White.\tState: PolygonOffset(0, 1)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 1);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw bottom-right. Color = Yellow.\tState: PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	{
		rr::Renderer		referenceRenderer;
		rr::VertexAttrib	attribs[2];
		rr::RenderState		state((rr::ViewportState)(rr::WindowRectangle(0, 0, m_targetSize, m_targetSize)));

		PositionColorShader program;

		attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
		attribs[0].size				= 4;
		attribs[0].stride			= 0;
		attribs[0].instanceDivisor	= 0;
		attribs[0].pointer			= triangleTopLeft;

		attribs[1].type				= rr::VERTEXATTRIBTYPE_DONT_CARE;
		attribs[1].generic			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);

		tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		log << TestLog::Message << "Expecting: Top-left = Green, Bottom-right = Yellow." << TestLog::EndMessage;

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));

		attribs[0].pointer = triangleBottomRight;
		attribs[1].generic = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));
	}

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}